

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> * __thiscall
Catch::Benchmark::Detail::
analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
          (SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,Detail *this,IConfig *cfg,
          Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> param_2,
          __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
          first,__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                last)

{
  double confidence_level;
  char cVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  int iVar2;
  size_type __n;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  it;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples;
  OutlierClassification outliers;
  double local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_b8;
  bootstrap_analysis local_98;
  OutlierClassification local_44;
  
  cVar1 = (**(code **)(*(long *)this + 0xa8))(this);
  __n = (long)first._M_current - (long)cfg >> 3;
  if (cVar1 == '\0') {
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve(&local_d8,__n);
    std::
    transform<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,Catch::Benchmark::Detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(Catch::IConfig_const&,Catch::Benchmark::Environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(std::chrono::duration<double,std::ratio<1l,1000000000l>>)_1_>
              (cfg,first._M_current,&local_d8);
    confidence_level = (double)(**(code **)(*(long *)this + 0xb8))(this);
    iVar2 = (**(code **)(*(long *)this + 0xc0))(this);
    last_00._M_current =
         local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    analyse_samples(&local_98,confidence_level,iVar2,
                    (iterator)
                    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (iterator)
                    local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_44,
               (Detail *)
               local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,last_00);
    local_b8.
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve(&local_b8,
              (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,Catch::Benchmark::Detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(Catch::IConfig_const&,Catch::Benchmark::Environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(double)_1_>
              (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_b8);
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->mean).point.__r = local_98.mean.point;
    (__return_storage_ptr__->mean).lower_bound.__r = local_98.mean.lower_bound;
    (__return_storage_ptr__->mean).upper_bound.__r = local_98.mean.upper_bound;
    (__return_storage_ptr__->mean).confidence_interval = local_98.mean.confidence_interval;
    (__return_storage_ptr__->standard_deviation).point.__r = local_98.standard_deviation.point;
    (__return_storage_ptr__->standard_deviation).lower_bound.__r =
         local_98.standard_deviation.lower_bound;
    (__return_storage_ptr__->standard_deviation).upper_bound.__r =
         local_98.standard_deviation.upper_bound;
    (__return_storage_ptr__->standard_deviation).confidence_interval =
         local_98.standard_deviation.confidence_interval;
    (__return_storage_ptr__->outliers).high_severe = local_44.high_severe;
    (__return_storage_ptr__->outliers).samples_seen = local_44.samples_seen;
    (__return_storage_ptr__->outliers).low_severe = local_44.low_severe;
    (__return_storage_ptr__->outliers).low_mild = local_44.low_mild;
    (__return_storage_ptr__->outliers).high_mild = local_44.high_mild;
    __return_storage_ptr__->outlier_variance = local_98.outlier_variance;
    if ((Detail *)
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (Detail *)0x0) {
      local_b8.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_98.mean.point = 0.0;
    local_98.mean.lower_bound = 0.0;
    local_98.mean.upper_bound = 0.0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)&local_98,__n);
    if (cfg < first._M_current) {
      local_e0 = 0.0;
      iVar2 = 0;
      do {
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)((duration<double,_std::ratio<1L,_1000000000L>_> *)cfg)->__r;
        if (local_98.mean.lower_bound == local_98.mean.upper_bound) {
          std::
          vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>
          ::_M_realloc_insert<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
                    ((vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>
                      *)&local_98,(iterator)local_98.mean.lower_bound,
                     (duration<double,_std::ratio<1L,_1000000000L>_> *)&local_d8);
        }
        else {
          *(rep *)local_98.mean.lower_bound =
               (rep)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_98.mean.lower_bound = (double)((long)local_98.mean.lower_bound + 8);
        }
        local_e0 = local_e0 + ((duration<double,_std::ratio<1L,_1000000000L>_> *)cfg)->__r;
        cfg = (IConfig *)((duration<double,_std::ratio<1L,_1000000000L>_> *)cfg + 1);
        iVar2 = iVar2 + 1;
      } while (cfg < first._M_current);
      local_e0 = local_e0 / (double)iVar2;
    }
    else {
      local_e0 = NAN;
    }
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98.mean.point;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98.mean.lower_bound;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98.mean.upper_bound;
    (__return_storage_ptr__->mean).point.__r = local_e0;
    (__return_storage_ptr__->mean).lower_bound.__r = local_e0;
    (__return_storage_ptr__->mean).upper_bound.__r = local_e0;
    __return_storage_ptr__->outlier_variance = 0.0;
    (__return_storage_ptr__->mean).confidence_interval = 0.0;
    (__return_storage_ptr__->standard_deviation).point.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).lower_bound.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).upper_bound.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).confidence_interval = 0.0;
    (__return_storage_ptr__->outliers).samples_seen = 0;
    (__return_storage_ptr__->outliers).low_severe = 0;
    (__return_storage_ptr__->outliers).low_severe = 0;
    (__return_storage_ptr__->outliers).low_mild = 0;
    (__return_storage_ptr__->outliers).high_mild = 0;
    (__return_storage_ptr__->outliers).high_severe = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

SampleAnalysis<Duration> analyse(const IConfig &cfg, Environment<Duration>, Iterator first, Iterator last) {
                if (!cfg.benchmarkNoAnalysis()) {
                    std::vector<double> samples;
                    samples.reserve(last - first);
                    std::transform(first, last, std::back_inserter(samples), [](Duration d) { return d.count(); });

                    auto analysis = Catch::Benchmark::Detail::analyse_samples(cfg.benchmarkConfidenceInterval(), cfg.benchmarkResamples(), samples.begin(), samples.end());
                    auto outliers = Catch::Benchmark::Detail::classify_outliers(samples.begin(), samples.end());

                    auto wrap_estimate = [](Estimate<double> e) {
                        return Estimate<Duration> {
                            Duration(e.point),
                                Duration(e.lower_bound),
                                Duration(e.upper_bound),
                                e.confidence_interval,
                        };
                    };
                    std::vector<Duration> samples2;
                    samples2.reserve(samples.size());
                    std::transform(samples.begin(), samples.end(), std::back_inserter(samples2), [](double d) { return Duration(d); });
                    return {
                        std::move(samples2),
                        wrap_estimate(analysis.mean),
                        wrap_estimate(analysis.standard_deviation),
                        outliers,
                        analysis.outlier_variance,
                    };
                } else {
                    std::vector<Duration> samples;
                    samples.reserve(last - first);

                    Duration mean = Duration(0);
                    int i = 0;
                    for (auto it = first; it < last; ++it, ++i) {
                        samples.push_back(Duration(*it));
                        mean += Duration(*it);
                    }
                    mean /= i;

                    return {
                        std::move(samples),
                        Estimate<Duration>{mean, mean, mean, 0.0},
                        Estimate<Duration>{Duration(0), Duration(0), Duration(0), 0.0},
                        OutlierClassification{},
                        0.0
                    };
                }
            }